

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

string * __thiscall
Assimp::FBX::FBXConverter::FixNodeName
          (string *__return_storage_ptr__,FBXConverter *this,string *name)

{
  pointer pcVar1;
  int iVar2;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)name);
  iVar2 = std::__cxx11::string::compare((char *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (iVar2 == 0) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::FixNodeName(const std::string& name) {
            // strip Model:: prefix, avoiding ambiguities (i.e. don't strip if
            // this causes ambiguities, well possible between empty identifiers,
            // such as "Model::" and ""). Make sure the behaviour is consistent
            // across multiple calls to FixNodeName().
            if (name.substr(0, 7) == "Model::") {
                std::string temp = name.substr(7);
                return temp;
            }

            return name;
        }